

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_type_patterns
                 (lysc_ctx *ctx,lysp_restr *patterns_p,lysc_pattern **base_patterns,
                 lysc_pattern ***patterns)

{
  lysc_pattern *plVar1;
  lysp_ext_instance *plVar2;
  LY_ERR ret__;
  LY_ERR LVar3;
  lysc_pattern **pplVar4;
  lysp_ext_instance *plVar5;
  long *plVar6;
  void *pvVar7;
  long *plVar8;
  lysp_ext_instance *plVar9;
  long lVar10;
  char *pcVar11;
  lysp_restr *plVar12;
  long lVar13;
  lysp_ext_instance *plVar14;
  long lVar15;
  long lVar16;
  
  if (base_patterns != (lysc_pattern **)0x0) {
    pplVar4 = lysc_patterns_dup(ctx->ctx,base_patterns);
    *patterns = pplVar4;
    if (pplVar4 == (lysc_pattern **)0x0) {
LAB_00145ffa:
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_type_patterns");
      return LY_EMEM;
    }
  }
  plVar14 = (lysp_ext_instance *)0x0;
  do {
    if (patterns_p == (lysp_restr *)0x0) {
      plVar5 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar5 = patterns_p[-1].exts;
    }
    if (plVar5 <= plVar14) {
      return LY_SUCCESS;
    }
    pplVar4 = *patterns;
    if (pplVar4 == (lysc_pattern **)0x0) {
      plVar6 = (long *)malloc(0x10);
      if (plVar6 == (long *)0x0) goto LAB_00145ffa;
      *plVar6 = 1;
      lVar13 = 1;
    }
    else {
      plVar1 = pplVar4[-1];
      pplVar4[-1] = (lysc_pattern *)((long)&plVar1->expr + 1);
      plVar6 = (long *)realloc(pplVar4 + -1,(long)plVar1 * 8 + 0x10);
      if (plVar6 == (long *)0x0) {
        (*patterns)[-1] = (lysc_pattern *)&(*patterns)[-1][-1].field_0x3f;
        goto LAB_00145ffa;
      }
      lVar13 = *plVar6;
    }
    *patterns = (lysc_pattern **)(plVar6 + 1);
    pvVar7 = calloc(1,0x40);
    plVar6[lVar13] = (long)pvVar7;
    *(undefined4 *)((long)pvVar7 + 0x38) = 2;
    LVar3 = lys_compile_type_pattern_check
                      (ctx->ctx,patterns_p[(long)plVar14].arg.str + 1,
                       (pcre2_code_8 **)((long)pvVar7 + 8));
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    plVar12 = patterns_p + (long)plVar14;
    pcVar11 = (plVar12->arg).str;
    if (*pcVar11 == '\x15') {
      *(uint *)(plVar6[lVar13] + 0x38) = *(uint *)(plVar6[lVar13] + 0x38) | 1;
      pcVar11 = (plVar12->arg).str;
    }
    LVar3 = lydict_insert(ctx->ctx,pcVar11 + 1,0,(char **)plVar6[lVar13]);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    LVar3 = lydict_dup(ctx->ctx,plVar12->eapptag,(char **)(plVar6[lVar13] + 0x28));
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    LVar3 = lydict_dup(ctx->ctx,plVar12->emsg,(char **)(plVar6[lVar13] + 0x20));
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    LVar3 = lydict_dup(ctx->ctx,plVar12->dsc,(char **)(plVar6[lVar13] + 0x10));
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    LVar3 = lydict_dup(ctx->ctx,plVar12->ref,(char **)(plVar6[lVar13] + 0x18));
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    plVar5 = plVar12->exts;
    if (plVar5 != (lysp_ext_instance *)0x0) {
      lVar15 = plVar6[lVar13];
      lVar16 = *(long *)(lVar15 + 0x30);
      if (lVar16 == 0) {
        plVar8 = (long *)calloc(1,(long)plVar5[-1].exts * 0x48 + 8);
        if (plVar8 == (long *)0x0) goto LAB_00145ffa;
        lVar10 = 0;
      }
      else {
        lVar10 = *(long *)(lVar16 + -8);
        plVar8 = (long *)realloc((void *)(lVar16 + -8),
                                 ((long)&(plVar5[-1].exts)->name + lVar10 * 2) * 0x48 + 8);
        if (plVar8 == (long *)0x0) goto LAB_00145ffa;
        lVar15 = plVar6[lVar13];
      }
      *(long **)(lVar15 + 0x30) = plVar8 + 1;
      if (*(long *)(plVar6[lVar13] + 0x30) != 0) {
        if (plVar12->exts == (lysp_ext_instance *)0x0) {
          plVar5 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar5 = plVar12->exts[-1].exts;
        }
        memset((void *)(*(long *)(plVar6[lVar13] + 0x30) + *plVar8 * 0x48),0,
               ((long)&plVar5->name + lVar10) * 0x48);
      }
      lVar16 = 0;
      plVar5 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar2 = plVar12->exts;
        if (plVar2 == (lysp_ext_instance *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = plVar2[-1].exts;
        }
        if (plVar9 <= plVar5) break;
        pvVar7 = (void *)plVar6[lVar13];
        lVar15 = *(long *)((long)pvVar7 + 0x30);
        lVar10 = *(long *)(lVar15 + -8);
        *(long *)(lVar15 + -8) = lVar10 + 1;
        LVar3 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar2->name + lVar16),
                                (lysc_ext_instance *)(lVar15 + lVar10 * 0x48),pvVar7);
        if (LVar3 != LY_SUCCESS) {
          if (LVar3 != LY_ENOT) {
            return LVar3;
          }
          plVar8 = (long *)(*(long *)(plVar6[lVar13] + 0x30) + -8);
          *plVar8 = *plVar8 + -1;
        }
        plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
        lVar16 = lVar16 + 0x70;
      }
    }
    plVar14 = (lysp_ext_instance *)((long)&plVar14->name + 1);
  } while( true );
}

Assistant:

LY_ERR
lys_compile_type_patterns(struct lysc_ctx *ctx, const struct lysp_restr *patterns_p, struct lysc_pattern **base_patterns,
        struct lysc_pattern ***patterns)
{
    struct lysc_pattern **pattern;
    LY_ARRAY_COUNT_TYPE u;
    LY_ERR ret = LY_SUCCESS;

    /* first, copy the patterns from the base type */
    if (base_patterns) {
        *patterns = lysc_patterns_dup(ctx->ctx, base_patterns);
        LY_CHECK_ERR_RET(!(*patterns), LOGMEM(ctx->ctx), LY_EMEM);
    }

    LY_ARRAY_FOR(patterns_p, u) {
        LY_ARRAY_NEW_RET(ctx->ctx, (*patterns), pattern, LY_EMEM);
        *pattern = calloc(1, sizeof **pattern);
        ++(*pattern)->refcount;

        ret = lys_compile_type_pattern_check(ctx->ctx, &patterns_p[u].arg.str[1], &(*pattern)->code);
        LY_CHECK_RET(ret);

        if (patterns_p[u].arg.str[0] == LYSP_RESTR_PATTERN_NACK) {
            (*pattern)->inverted = 1;
        }
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, &patterns_p[u].arg.str[1], 0, &(*pattern)->expr), done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].eapptag, (*pattern)->eapptag, ret, done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].emsg, (*pattern)->emsg, ret, done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].dsc, (*pattern)->dsc, ret, done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].ref, (*pattern)->ref, ret, done);
        COMPILE_EXTS_GOTO(ctx, patterns_p[u].exts, (*pattern)->exts, (*pattern), ret, done);
    }
done:
    return ret;
}